

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool redit_show(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  short sVar2;
  ROOM_INDEX_DATA *pRVar3;
  TRAP_DATA *pTVar4;
  EXIT_DATA *pEVar5;
  long *plVar6;
  bool bVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  char cVar11;
  long lVar12;
  EXTRA_DESCR_DATA *ed;
  EXTRA_DESCR_DATA *pEVar13;
  CHAR_DATA *pCVar14;
  OBJ_DATA *pOVar15;
  basic_string_view<char> format;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  char buf1 [9216];
  char buf [4608];
  char word [4608];
  char reset_state [4608];
  long *local_5a58 [2];
  long local_5a48 [2];
  char local_5a38 [12];
  char cStack_5a2c;
  undefined8 auStack_5a2b [1150];
  char local_3638 [4608];
  buffer<char> local_2438;
  char local_2418 [4576];
  char *local_1238 [2];
  ulong local_1228;
  ulong local_1218;
  ulong local_1208;
  char *local_11f8;
  char *local_11e8;
  
  pRVar3 = ch->in_room;
  local_5a38[0] = '\0';
  sprintf(local_3638,"Description:\n\r%s",pRVar3->description);
  strcat(local_5a38,local_3638);
  if (pRVar3->alt_description == (char *)0x0) {
    sVar9 = strlen(local_5a38);
    *(undefined8 *)((long)auStack_5a2b + sVar9) = 0xd0a5d656e6f4e;
    builtin_strncpy(local_5a38 + sVar9,"Alt Desc:   ",0xc);
    builtin_strncpy(&cStack_5a2c + sVar9,"[Non",4);
  }
  else {
    sprintf(local_3638,"Alt Desc:\n\r%sAlternate Room Title is %s.\n\rDescription is %s.\n\r",
            pRVar3->alt_description,pRVar3->alt_name,
            altdesc_condtable[pRVar3->alt_description_cond].display);
    strcat(local_5a38,local_3638);
  }
  sprintf(local_3638,"Name:       [%s]\n\rArea:       [%5d] %s\n\r",pRVar3->name,
          (ulong)(uint)pRVar3->area->vnum,pRVar3->area->name);
  strcat(local_5a38,local_3638);
  sVar2 = pRVar3->vnum;
  pcVar8 = flag_string_old(sector_flags,(int)pRVar3->sector_type);
  sprintf(local_3638,"Vnum:       [%5d]\n\rSector:     [%s]\n\r",(ulong)(uint)(int)sVar2,pcVar8);
  strcat(local_5a38,local_3638);
  sprintf(local_3638,"Cabal:      [%s]\n\r",cabal_table[pRVar3->cabal].name);
  strcat(local_5a38,local_3638);
  pcVar8 = pRVar3->owner;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = "None";
  }
  sprintf(local_3638,"Owner:      [%s]\n\r",pcVar8);
  strcat(local_5a38,local_3638);
  pcVar8 = flag_string(room_flags,pRVar3->room_flags);
  sprintf(local_3638,"Room flags: [%s]\n\r",pcVar8);
  strcat(local_5a38,local_3638);
  sprintf(local_3638,"Health recovery:[%d]\n\rMana recovery  :[%d]\n\r",
          (ulong)(uint)(int)pRVar3->heal_rate,(ulong)(uint)(int)pRVar3->mana_rate);
  strcat(local_5a38,local_3638);
  sVar9 = strlen(local_5a38);
  builtin_strncpy(local_5a38 + sVar9,"Trap:",6);
  if (pRVar3->trap == (TRAP_DATA *)0x0) {
    sVar9 = strlen(local_5a38);
    builtin_strncpy(local_5a38 + sVar9,"       [None]\n\r",0x10);
  }
  else {
    local_1238[0] = flag_name_lookup((long)pRVar3->trap->type,trap_table);
    pTVar4 = pRVar3->trap;
    local_11f8 = pTVar4->trig_echo;
    local_11e8 = pTVar4->exec_echo;
    if (local_11f8 == (char *)0x0) {
      local_11f8 = "None";
    }
    if (local_11e8 == (char *)0x0) {
      local_11e8 = "None";
    }
    local_1228 = (ulong)(uint)pTVar4->quality;
    local_1218 = (ulong)(uint)pTVar4->complexity;
    local_1208 = (ulong)(uint)pTVar4->timer;
    local_2438.size_ = 0;
    local_2438._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
    local_2438.capacity_ = 500;
    format.size_ = 0x90;
    format.data_ = 
    "\n\r Type:          [%s]\n\r Quality:       [%2d]\n\r Complexity:    [%3d]\n\r Timer:         [%d seconds]\n\r Trigger Echo:  [%s]\n\r Execute Echo:  [%s]\n\r"
    ;
    args.field_1.values_ =
         (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)local_1238;
    args.desc_ = 0xcc111c;
    local_2438.ptr_ = local_2418;
    fmt::v9::detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
              (&local_2438,format,args);
    local_5a58[0] = local_5a48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_5a58,local_2438.ptr_,local_2438.ptr_ + local_2438.size_);
    if (local_2438.ptr_ != local_2418) {
      operator_delete(local_2438.ptr_,local_2438.capacity_);
    }
    plVar6 = local_5a58[0];
    strcat(local_5a38,(char *)local_5a58[0]);
    if (plVar6 != local_5a48) {
      operator_delete(plVar6,local_5a48[0] + 1);
    }
  }
  send_to_char(local_5a38,ch);
  local_5a38[0] = '\0';
  bVar7 = IS_ZERO_VECTOR(pRVar3->progtypes);
  if (!bVar7) {
    send_to_char("Room Programs:\n\r",ch);
    uVar10 = pRVar3->progtypes[0];
    if ((uVar10 & 1) != 0) {
      sprintf(local_3638," [pulse_prog] %s\n\r",pRVar3->rprogs->pulse_name);
      send_to_char(local_3638,ch);
      uVar10 = pRVar3->progtypes[0];
    }
    if ((uVar10 & 2) != 0) {
      sprintf(local_3638," [entry_prog] %s\n\r",pRVar3->rprogs->entry_name);
      send_to_char(local_3638,ch);
      uVar10 = pRVar3->progtypes[0];
    }
    if ((uVar10 & 4) != 0) {
      sprintf(local_3638," [move_prog] %s\n\r",pRVar3->rprogs->move_name);
      send_to_char(local_3638,ch);
      uVar10 = pRVar3->progtypes[0];
    }
    if ((uVar10 & 8) != 0) {
      sprintf(local_3638," [drop_prog] %s\n\r",pRVar3->rprogs->drop_name);
      send_to_char(local_3638,ch);
      uVar10 = pRVar3->progtypes[0];
    }
    if ((uVar10 & 0x10) != 0) {
      sprintf(local_3638," [speech_prog] %s\n\r",pRVar3->rprogs->speech_name);
      send_to_char(local_3638,ch);
      uVar10 = pRVar3->progtypes[0];
    }
    if ((uVar10 & 0x20) != 0) {
      sprintf(local_3638," [open_prog] %s\n\r",pRVar3->rprogs->open_name);
      send_to_char(local_3638,ch);
    }
  }
  sVar9 = strlen(local_5a38);
  builtin_strncpy(local_5a38 + sVar9,"Characters: [",0xe);
  pCVar14 = pRVar3->people;
  if (pCVar14 == (CHAR_DATA *)0x0) {
    sVar9 = strlen(local_5a38);
    builtin_strncpy(local_5a38 + sVar9,"none]\n\r",8);
  }
  else {
    do {
      one_argument(pCVar14->name,local_3638);
      strcat(local_5a38,local_3638);
      sVar9 = strlen(local_5a38);
      (local_5a38 + sVar9)[0] = ' ';
      (local_5a38 + sVar9)[1] = '\0';
      pCVar14 = pCVar14->next_in_room;
    } while (pCVar14 != (CHAR_DATA *)0x0);
    sVar9 = strlen(local_5a38);
    local_5a38[(long)((sVar9 << 0x20) + -0x100000000) >> 0x20] = ']';
    sVar9 = strlen(local_5a38);
    (local_5a38 + sVar9)[0] = '\n';
    (local_5a38 + sVar9)[1] = '\r';
    local_5a38[sVar9 + 2] = '\0';
  }
  sVar9 = strlen(local_5a38);
  builtin_strncpy(local_5a38 + sVar9,"Objects:    [",0xe);
  pOVar15 = pRVar3->contents;
  if (pOVar15 == (OBJ_DATA *)0x0) {
    sVar9 = strlen(local_5a38);
    builtin_strncpy(local_5a38 + sVar9,"none]\n\r",8);
  }
  else {
    do {
      one_argument(pOVar15->name,local_3638);
      strcat(local_5a38,local_3638);
      sVar9 = strlen(local_5a38);
      (local_5a38 + sVar9)[0] = ' ';
      (local_5a38 + sVar9)[1] = '\0';
      pOVar15 = pOVar15->next_content;
    } while (pOVar15 != (OBJ_DATA *)0x0);
    sVar9 = strlen(local_5a38);
    local_5a38[(long)((sVar9 << 0x20) + -0x100000000) >> 0x20] = ']';
    sVar9 = strlen(local_5a38);
    (local_5a38 + sVar9)[0] = '\n';
    (local_5a38 + sVar9)[1] = '\r';
    local_5a38[sVar9 + 2] = '\0';
  }
  pEVar13 = pRVar3->extra_descr;
  if (pEVar13 != (EXTRA_DESCR_DATA *)0x0) {
    do {
      sVar9 = strlen(local_5a38);
      *(undefined8 *)((long)auStack_5a2b + sVar9) = 0x203a64726f7779;
      builtin_strncpy(local_5a38 + sVar9,"Extra Desc Keywo",0x10);
      strcat(local_5a38,pEVar13->keyword);
      sVar9 = strlen(local_5a38);
      (local_5a38 + sVar9)[0] = '\n';
      (local_5a38 + sVar9)[1] = '\r';
      local_5a38[sVar9 + 2] = '\0';
      pEVar13 = pEVar13->next;
    } while (pEVar13 != (EXTRA_DESCR_DATA *)0x0);
  }
  lVar12 = 0;
  do {
    pEVar5 = pRVar3->exit[lVar12];
    if (pEVar5 != (EXIT_DATA *)0x0) {
      pcVar8 = capitalize(dir_name[lVar12]);
      if ((pEVar5->u1).to_room == (ROOM_INDEX_DATA *)0x0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)(uint)(int)((pEVar5->u1).to_room)->vnum;
      }
      sprintf(local_3638,"-%-5s to [%5d] Key: [%5d] ",pcVar8,uVar10,(ulong)(uint)(int)pEVar5->key);
      strcat(local_5a38,local_3638);
      pcVar8 = flag_string(exit_flags,pEVar5->exit_info);
      sVar9 = strlen(local_5a38);
      builtin_strncpy(local_5a38 + sVar9," Exit flags: [",0xf);
      pcVar8 = one_argument(pcVar8,(char *)&local_2438);
      while ((char)local_2438._vptr_buffer != '\0') {
        bVar7 = str_infix((char *)&local_2438,(char *)local_1238);
        if (bVar7) {
          sVar9 = strlen((char *)&local_2438);
          if (0 < (int)(uint)sVar9) {
            uVar10 = 0;
            do {
              cVar1 = *(char *)((long)&local_2438._vptr_buffer + uVar10);
              cVar11 = cVar1 + -0x20;
              if (0x19 < (byte)(cVar1 + 0x9fU)) {
                cVar11 = cVar1;
              }
              *(char *)((long)&local_2438._vptr_buffer + uVar10) = cVar11;
              uVar10 = uVar10 + 1;
            } while (((uint)sVar9 & 0x7fffffff) != uVar10);
          }
        }
        strcat(local_5a38,(char *)&local_2438);
        sVar9 = strlen(local_5a38);
        (local_5a38 + sVar9)[0] = ' ';
        (local_5a38 + sVar9)[1] = '\0';
        pcVar8 = one_argument(pcVar8,(char *)&local_2438);
      }
      sVar9 = strlen(local_5a38);
      local_5a38[(long)((sVar9 << 0x20) + -0x100000000) >> 0x20] = ']';
      sVar9 = strlen(local_5a38);
      (local_5a38 + sVar9)[0] = '\n';
      (local_5a38 + sVar9)[1] = '\r';
      local_5a38[sVar9 + 2] = '\0';
      if ((pEVar5->keyword != (char *)0x0) && (*pEVar5->keyword != '\0')) {
        sprintf(local_3638,"Kwds: [%s]\n\r");
        strcat(local_5a38,local_3638);
      }
      pcVar8 = pEVar5->description;
      if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
        strcpy(local_3638,pcVar8);
        strcat(local_5a38,local_3638);
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 6);
  send_to_char(local_5a38,ch);
  send_to_char("Syntax:  resets\n\r---- RESETS ----\n\r",ch);
  do_resets(ch,"");
  return false;
}

Assistant:

bool redit_show(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom;
	char buf[MAX_STRING_LENGTH];
	char buf1[2 * MAX_STRING_LENGTH];
	OBJ_DATA *obj;
	CHAR_DATA *rch;
	int door;
	bool fcnt;

	EDIT_ROOM(ch, pRoom);

	buf1[0] = '\0';

	sprintf(buf, "Description:\n\r%s", pRoom->description);
	strcat(buf1, buf);

	if (pRoom->alt_description)
	{
		sprintf(buf, "Alt Desc:\n\r%sAlternate Room Title is %s.\n\rDescription is %s.\n\r",
			pRoom->alt_description,
			pRoom->alt_name,
			altdesc_condtable[pRoom->alt_description_cond].display);
		strcat(buf1, buf);
	}
	else
		strcat(buf1, "Alt Desc:   [None]\n\r");

	sprintf(buf, "Name:       [%s]\n\rArea:       [%5d] %s\n\r",
		pRoom->name,
		pRoom->area->vnum,
		pRoom->area->name);
	strcat(buf1, buf);

	sprintf(buf, "Vnum:       [%5d]\n\rSector:     [%s]\n\r",
		pRoom->vnum,
		flag_string_old(sector_flags, pRoom->sector_type));
	strcat(buf1, buf);

	sprintf(buf, "Cabal:      [%s]\n\r", cabal_table[pRoom->cabal].name);
	strcat(buf1, buf);

	sprintf(buf, "Owner:      [%s]\n\r", (pRoom->owner) ? pRoom->owner : "None");
	strcat(buf1, buf);

	sprintf(buf, "Room flags: [%s]\n\r", flag_string(room_flags, pRoom->room_flags));
	strcat(buf1, buf);

	sprintf(buf, "Health recovery:[%d]\n\rMana recovery  :[%d]\n\r", pRoom->heal_rate, pRoom->mana_rate);
	strcat(buf1, buf);

	strcat(buf1, "Trap:");

	if (pRoom->trap)
	{
		auto buffer = 
			fmt::sprintf("\n\r Type:          [%s]\n\r Quality:       [%2d]\n\r Complexity:    [%3d]\n\r Timer:         [%d seconds]\n\r Trigger Echo:  [%s]\n\r Execute Echo:  [%s]\n\r",
				flag_name_lookup(pRoom->trap->type, trap_table),
				pRoom->trap->quality,
				pRoom->trap->complexity,
				pRoom->trap->timer,
				(pRoom->trap->trig_echo != nullptr) ? pRoom->trap->trig_echo : "None",
				(pRoom->trap->exec_echo != nullptr) ? pRoom->trap->exec_echo : "None"); //TODO: change the rest of the sprintf calls to format

		strcat(buf1, buffer.data());
	}
	else
	{
		strcat(buf1, "       [None]\n\r");
	}

	send_to_char(buf1, ch);
	buf1[0] = '\0';

	if (!IS_ZERO_VECTOR(pRoom->progtypes))
	{
		send_to_char("Room Programs:\n\r", ch);
		if (IS_SET(pRoom->progtypes, RPROG_PULSE))
		{
			sprintf(buf, " [pulse_prog] %s\n\r", pRoom->rprogs->pulse_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_ENTRY))
		{
			sprintf(buf, " [entry_prog] %s\n\r", pRoom->rprogs->entry_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_MOVE))
		{
			sprintf(buf, " [move_prog] %s\n\r", pRoom->rprogs->move_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_DROP))
		{
			sprintf(buf, " [drop_prog] %s\n\r", pRoom->rprogs->drop_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_SPEECH))
		{
			sprintf(buf, " [speech_prog] %s\n\r", pRoom->rprogs->speech_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_OPEN))
		{
			sprintf(buf, " [open_prog] %s\n\r", pRoom->rprogs->open_name);
			send_to_char(buf, ch);
		}
	}

	strcat(buf1, "Characters: [");
	fcnt = false;

	for (rch = pRoom->people; rch; rch = rch->next_in_room)
	{
		one_argument(rch->name, buf);
		strcat(buf1, buf);
		strcat(buf1, " ");
		fcnt = true;
	}

	if (fcnt)
	{
		int end = strlen(buf1) - 1;
		buf1[end] = ']';
		strcat(buf1, "\n\r");
	}
	else
	{
		strcat(buf1, "none]\n\r");
	}

	strcat(buf1, "Objects:    [");
	fcnt = false;

	for (obj = pRoom->contents; obj; obj = obj->next_content)
	{
		one_argument(obj->name, buf);
		strcat(buf1, buf);
		strcat(buf1, " ");
		fcnt = true;
	}

	if (fcnt)
	{
		int end = strlen(buf1) - 1;
		buf1[end] = ']';
		strcat(buf1, "\n\r");
	}
	else
	{
		strcat(buf1, "none]\n\r");
	}

	if (pRoom->extra_descr)
	{
		for (EXTRA_DESCR_DATA *ed = pRoom->extra_descr; ed; ed = ed->next)
		{
			strcat(buf1, "Extra Desc Keyword: ");
			strcat(buf1, ed->keyword);
			strcat(buf1, "\n\r");
		}
	}

	for (door = 0; door < MAX_DIR; door++)
	{
		EXIT_DATA *pexit = pRoom->exit[door];

		if (pexit != nullptr)
		{
			char word[MAX_INPUT_LENGTH];
			char reset_state[MAX_STRING_LENGTH];
			char *state;
			int i, length;

			sprintf(buf, "-%-5s to [%5d] Key: [%5d] ",
				capitalize(dir_name[door]),
				pexit->u1.to_room ? pexit->u1.to_room->vnum : 0, /* ROM OLC */
				pexit->key);
			strcat(buf1, buf);

			/*
			 * Format up the exit info.
			 * Capitalize all flags that are not part of the reset info.
			 */
			state = flag_string(exit_flags, pexit->exit_info);
			strcat(buf1, " Exit flags: [");

			for (;;)
			{
				state = one_argument(state, word);

				if (word[0] == '\0')
				{
					int end = strlen(buf1) - 1;
					buf1[end] = ']';
					strcat(buf1, "\n\r");
					break;
				}

				if (str_infix(word, reset_state))
				{
					length = strlen(word);

					for (i = 0; i < length; i++)
					{
						word[i] = UPPER(word[i]);
					}
				}

				strcat(buf1, word);
				strcat(buf1, " ");
			}

			if (pexit->keyword && pexit->keyword[0] != '\0')
			{
				sprintf(buf, "Kwds: [%s]\n\r", pexit->keyword);
				strcat(buf1, buf);
			}

			if (pexit->description && pexit->description[0] != '\0')
			{
				sprintf(buf, "%s", pexit->description);
				strcat(buf1, buf);
			}
		}
	}

	send_to_char(buf1, ch);
	send_to_char("Syntax:  resets\n\r---- RESETS ----\n\r", ch);
	do_resets(ch, "");
	return false;
}